

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall crnlib::dxt1_endpoint_optimizer::return_solution(dxt1_endpoint_optimizer *this)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  value_type *pvVar4;
  byte *pbVar5;
  undefined1 *puVar6;
  long *in_RDI;
  uint unique_color_index_1;
  const_iterator it_1;
  uint8 selector_1;
  uint32 c_1;
  uint32 prev_color;
  uint8 prev_selector;
  uint8 *pDst_selectors_end;
  uint selector;
  uint unique_color_index;
  const_iterator it;
  uint32 c;
  uint8 *pDst_selectors;
  uint32 *pSrc_pixels;
  uint alpha_thresh;
  uint8 *pInvert_table;
  bool invert_selectors;
  dxt1_endpoint_optimizer *in_stack_ffffffffffffff20;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *phVar7;
  undefined4 in_stack_ffffffffffffff30;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *in_stack_ffffffffffffff38;
  iterator local_b0;
  const_iterator local_a0;
  undefined1 local_8d;
  uint local_8c;
  uint local_88;
  undefined1 local_81;
  undefined1 *local_80;
  uint local_78;
  uint local_74;
  iterator local_70;
  const_iterator local_60;
  uint local_4c;
  undefined1 *local_48;
  uint *local_40;
  uint local_34;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *local_30;
  bool local_21;
  uint *local_18;
  uint *local_10;
  uint local_8;
  uint local_4;
  
  compute_selectors(in_stack_ffffffffffffff20);
  if ((*(byte *)(in_RDI + 0x12f) & 1) == 0) {
    local_21 = *(ushort *)(in_RDI + 299) < *(ushort *)((long)in_RDI + 0x95a);
  }
  else {
    local_21 = *(ushort *)((long)in_RDI + 0x95a) < *(ushort *)(in_RDI + 299);
  }
  *(byte *)(in_RDI[1] + 0x1a) = *(byte *)((long)in_RDI + 0x979) & 1;
  *(byte *)(in_RDI[1] + 0x1b) = *(byte *)((long)in_RDI + 0x97a) & 1;
  *(undefined1 *)(in_RDI[1] + 0x1c) = *(undefined1 *)((long)in_RDI + 0x97b);
  *(bool *)(in_RDI[1] + 0x19) = local_21;
  if (local_21 == false) {
    *(short *)(in_RDI[1] + 8) = (short)in_RDI[299];
    *(undefined2 *)(in_RDI[1] + 10) = *(undefined2 *)((long)in_RDI + 0x95a);
  }
  else {
    *(undefined2 *)(in_RDI[1] + 8) = *(undefined2 *)((long)in_RDI + 0x95a);
    *(short *)(in_RDI[1] + 10) = (short)in_RDI[299];
  }
  local_30 = (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
              *)&g_invTableNull;
  if (local_21 != false) {
    if ((*(byte *)(in_RDI + 0x12f) & 1) == 0) {
      in_stack_ffffffffffffff38 =
           (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
            *)&g_invTableColor;
      local_30 = in_stack_ffffffffffffff38;
    }
    else {
      in_stack_ffffffffffffff38 =
           (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
            *)&g_invTableAlpha;
      local_30 = in_stack_ffffffffffffff38;
    }
  }
  if ((*(byte *)(*in_RDI + 0x1c) & 1) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(int *)(*in_RDI + 0x14) << 0x18;
  }
  local_40 = *(uint **)(*in_RDI + 8);
  local_48 = *(undefined1 **)(in_RDI[1] + 0x10);
  local_34 = uVar2;
  uVar3 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 7));
  if ((uVar3 == 1) && ((*(byte *)(*in_RDI + 0x1c) & 1) == 0)) {
    local_10 = local_40;
    local_8 = *local_40;
    local_4c = local_8 | 0xff000000;
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::find(in_stack_ffffffffffffff38,(uint *)CONCAT44(uVar2,in_stack_ffffffffffffff30));
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::const_iterator::const_iterator(&local_60,&local_70);
    pvVar4 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
             ::const_iterator::operator->((const_iterator *)0x1d6381);
    phVar7 = local_30;
    local_74 = pvVar4->second;
    pbVar5 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 300),local_74);
    local_78 = (uint)*(byte *)((long)&(phVar7->m_values).m_p + (ulong)*pbVar5);
    memset(local_48,local_78,(ulong)*(uint *)(*in_RDI + 0x10));
  }
  else {
    local_80 = local_48 + *(uint *)(*in_RDI + 0x10);
    local_81 = 0;
    local_88 = 0;
    do {
      local_18 = local_40;
      local_4 = *local_40;
      local_40 = local_40 + 1;
      local_8d = 3;
      uVar1 = local_8d;
      if ((local_34 <= local_4) &&
         (local_8c = local_4 | 0xff000000, uVar1 = local_81, local_8c != local_88)) {
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::find(in_stack_ffffffffffffff38,(uint *)CONCAT44(uVar2,in_stack_ffffffffffffff30));
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::const_iterator::const_iterator(&local_a0,&local_b0);
        pvVar4 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 ::const_iterator::operator->((const_iterator *)0x1d64ba);
        phVar7 = local_30;
        pbVar5 = vector<unsigned_char>::operator[]
                           ((vector<unsigned_char> *)(in_RDI + 300),pvVar4->second);
        local_81 = *(undefined1 *)((long)&(phVar7->m_values).m_p + (ulong)*pbVar5);
        local_88 = local_8c;
        uVar1 = local_81;
      }
      local_8d = uVar1;
      puVar6 = local_48 + 1;
      *local_48 = local_8d;
      local_48 = puVar6;
    } while (puVar6 != local_80);
  }
  *(byte *)(in_RDI[1] + 0x18) = *(byte *)(in_RDI + 0x12f) & 1;
  *(long *)in_RDI[1] = in_RDI[0x12e];
  return;
}

Assistant:

void dxt1_endpoint_optimizer::return_solution() {
  compute_selectors();
  bool invert_selectors;

  if (m_best_solution.m_alpha_block)
    invert_selectors = (m_best_solution.m_coords.m_low_color > m_best_solution.m_coords.m_high_color);
  else {
    CRNLIB_ASSERT(m_best_solution.m_coords.m_low_color != m_best_solution.m_coords.m_high_color);

    invert_selectors = (m_best_solution.m_coords.m_low_color < m_best_solution.m_coords.m_high_color);
  }

  m_pResults->m_alternate_rounding = m_best_solution.m_alternate_rounding;
  m_pResults->m_enforce_selector = m_best_solution.m_enforce_selector;
  m_pResults->m_enforced_selector = m_best_solution.m_enforced_selector;
  m_pResults->m_reordered = invert_selectors;
  if (invert_selectors) {
    m_pResults->m_low_color = m_best_solution.m_coords.m_high_color;
    m_pResults->m_high_color = m_best_solution.m_coords.m_low_color;
  } else {
    m_pResults->m_low_color = m_best_solution.m_coords.m_low_color;
    m_pResults->m_high_color = m_best_solution.m_coords.m_high_color;
  }

  const uint8* pInvert_table = g_invTableNull;
  if (invert_selectors)
    pInvert_table = m_best_solution.m_alpha_block ? g_invTableAlpha : g_invTableColor;

  const uint alpha_thresh = m_pParams->m_pixels_have_alpha ? (m_pParams->m_dxt1a_alpha_threshold << 24U) : 0;

  const uint32* pSrc_pixels = reinterpret_cast<const uint32*>(m_pParams->m_pPixels);
  uint8* pDst_selectors = m_pResults->m_pSelectors;

  if ((m_unique_colors.size() == 1) && (!m_pParams->m_pixels_have_alpha)) {
    uint32 c = utils::read_le32(pSrc_pixels);

    CRNLIB_ASSERT(c >= alpha_thresh);

    c |= 0xFF000000U;

    unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));
    CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

    uint unique_color_index = it->second;

    uint selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

    memset(pDst_selectors, selector, m_pParams->m_num_pixels);
  } else {
    uint8* pDst_selectors_end = pDst_selectors + m_pParams->m_num_pixels;

    uint8 prev_selector = 0;
    uint32 prev_color = 0;

    do {
      uint32 c = utils::read_le32(pSrc_pixels);
      pSrc_pixels++;

      uint8 selector = 3;

      if (c >= alpha_thresh) {
        c |= 0xFF000000U;

        if (c == prev_color)
          selector = prev_selector;
        else {
          unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));

          CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

          uint unique_color_index = it->second;

          selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

          prev_color = c;
          prev_selector = selector;
        }
      }

      *pDst_selectors++ = selector;

    } while (pDst_selectors != pDst_selectors_end);
  }

  m_pResults->m_alpha_block = m_best_solution.m_alpha_block;
  m_pResults->m_error = m_best_solution.m_error;
}